

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

void init_motion_compensation_nstep(search_site_config *cfg,int stride,int level)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  double dVar8;
  int local_58;
  short local_54;
  undefined2 uStack_52;
  short local_50;
  undefined4 local_4e;
  short local_4a;
  undefined2 local_48;
  short local_46;
  short local_44;
  short local_42;
  short local_40;
  short local_3e;
  short local_3c;
  short local_3a;
  FULLPEL_MV search_site_mvs [13];
  
  cfg->stride = stride;
  uVar1 = (0 < level) + 0xf;
  piVar2 = &cfg->site[0][0].offset;
  iVar5 = 1;
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    iVar3 = (int)((double)iVar5 * 0.41);
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    bVar6 = 5 < iVar5 && level < 1;
    local_58 = 0;
    local_50 = (short)iVar5;
    local_54 = -local_50;
    uStack_52 = 0;
    local_4e = 0;
    local_4a = local_54;
    local_48 = 0;
    local_46 = local_50;
    if (5 >= iVar5 || level >= 1) {
      iVar3 = iVar5;
    }
    local_44 = local_54;
    local_3e = (short)iVar3;
    local_42 = -local_3e;
    local_40 = local_50;
    local_3c = local_42;
    local_3a = local_50;
    search_site_mvs[0].row = local_3e;
    search_site_mvs[0].col = local_54;
    search_site_mvs[1].row = local_54;
    search_site_mvs[1].col = local_3e;
    search_site_mvs[2].row = local_50;
    search_site_mvs[2].col = local_42;
    search_site_mvs[3].row = local_3e;
    search_site_mvs[3].col = local_50;
    search_site_mvs[4].row = local_42;
    search_site_mvs[4].col = local_54;
    for (uVar7 = 0; (uint)bVar6 * 4 + 9 != uVar7; uVar7 = uVar7 + 1) {
      iVar3 = (&local_58)[uVar7];
      piVar2[uVar7 * 2 + -1] = iVar3;
      piVar2[uVar7 * 2] = (iVar3 >> 0x10) + (short)iVar3 * stride;
    }
    cfg->searches_per_step[uVar4] = (uint)bVar6 * 4 + 8;
    cfg->radius[uVar4] = iVar5;
    if (uVar4 < 0xc) {
      dVar8 = (double)iVar5 * 1.5 + 0.5;
      if (dVar8 <= (double)(iVar5 + 1)) {
        dVar8 = (double)(iVar5 + 1);
      }
      iVar5 = (int)dVar8;
    }
    piVar2 = piVar2 + 0x22;
  }
  cfg->num_search_steps = uVar1;
  return;
}

Assistant:

static void init_motion_compensation_nstep(search_site_config *cfg, int stride,
                                           int level) {
  int num_search_steps = 0;
  int stage_index = 0;
  cfg->stride = stride;
  int radius = 1;
  const int num_stages = (level > 0) ? 16 : 15;
  for (stage_index = 0; stage_index < num_stages; ++stage_index) {
    int tan_radius = AOMMAX((int)(0.41 * radius), 1);
    int num_search_pts = 12;
    if ((radius <= 5) || (level > 0)) {
      tan_radius = radius;
      num_search_pts = 8;
    }
    const FULLPEL_MV search_site_mvs[13] = {
      { 0, 0 },
      { -radius, 0 },
      { radius, 0 },
      { 0, -radius },
      { 0, radius },
      { -radius, -tan_radius },
      { radius, tan_radius },
      { -tan_radius, radius },
      { tan_radius, -radius },
      { -radius, tan_radius },
      { radius, -tan_radius },
      { tan_radius, radius },
      { -tan_radius, -radius },
    };

    for (int i = 0; i <= num_search_pts; ++i) {
      search_site *const site = &cfg->site[stage_index][i];
      site->mv = search_site_mvs[i];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    cfg->searches_per_step[stage_index] = num_search_pts;
    cfg->radius[stage_index] = radius;
    ++num_search_steps;
    if (stage_index < 12)
      radius = (int)AOMMAX((radius * 1.5 + 0.5), radius + 1);
  }
  cfg->num_search_steps = num_search_steps;
}